

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processTimeMonitorMessage(CoreBroker *this,ActionMessage *message)

{
  double dVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar2;
  action_t aVar3;
  __int_type_conflict _Var4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  __atomic_float<double> *this_00;
  ActionMessage *in_RSI;
  char *in_RDI;
  __sv_type _Var6;
  format_args in_stack_00000000;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffffda8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdb0;
  double local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [32];
  __sv_type local_1b8;
  __sv_type local_1a8;
  BaseType local_198;
  double local_188;
  char *local_180;
  undefined8 local_178;
  undefined1 local_170 [32];
  __sv_type local_150;
  __sv_type local_140;
  BaseType local_12c;
  TimeRepresentation<count_time<9,_long>_> local_128 [4];
  undefined4 in_stack_ffffffffffffff00;
  BaseType BVar8;
  GlobalFederateId id;
  char *pcVar9;
  undefined1 local_e8 [4];
  GlobalFederateId in_stack_ffffffffffffff1c;
  GlobalFederateId federateID;
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  double *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 *local_a0;
  double local_98 [2];
  undefined8 local_88;
  double *local_80;
  char *local_78;
  undefined8 uStack_70;
  double *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  double local_40;
  double *local_38;
  double local_30;
  undefined1 *local_28;
  double *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  id.gid = *(BaseType *)(in_RDI + 0xdb8);
  pcVar9 = in_RDI;
  bVar2 = GlobalFederateId::operator!=(&in_RSI->source_id,id);
  if (!bVar2) {
    aVar3 = ActionMessage::action(in_RSI);
    if (aVar3 == cmd_disconnect) {
      _Var4 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffda8);
      if (5 < _Var4) {
        local_198 = (in_RSI->source_id).gid;
        local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffda0);
        local_1e8 = "TIME: disconnected, last time {}";
        local_1e0 = 0x20;
        local_1f0 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x53c1af);
        local_a0 = local_1d8;
        local_b0 = local_1e8;
        uStack_a8 = local_1e0;
        local_b8 = &local_1f0;
        local_c8 = local_1e8;
        uStack_c0 = local_1e0;
        local_28 = local_e8;
        federateID.gid = (BaseType)((ulong)local_1f0 >> 0x20);
        local_8 = &local_d8;
        local_d8 = 10;
        local_30 = local_1f0;
        local_10 = local_28;
        local_d0 = local_28;
        ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000010,in_stack_00000000);
        local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffda0);
        name_01._M_str = pcVar9;
        name_01._M_len = (size_t)in_RSI;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8._M_str;
        BrokerBase::sendToLogger
                  ((BrokerBase *)CONCAT44(id.gid,in_stack_ffffffffffffff00),federateID,
                   local_128[4].internalTimeCode._4_4_,name_01,in_stack_00000040,
                   local_128[4].internalTimeCode._3_1_);
        std::__cxx11::string::~string(pbVar7);
      }
      TVar5 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      *(baseType *)(in_RDI + 0xdd0) = TVar5.internalTimeCode;
      TVar5 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      *(baseType *)(in_RDI + 0xdc8) = TVar5.internalTimeCode;
      this_00 = (__atomic_float<double> *)(in_RDI + 0xdd8);
      dVar1 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x53c371);
      std::__atomic_float<double>::store(this_00,dVar1,seq_cst);
    }
    else if (aVar3 == cmd_exec_grant) {
      in_RDI[0xdc8] = '\0';
      in_RDI[0xdc9] = '\0';
      in_RDI[0xdca] = '\0';
      in_RDI[0xdcb] = '\0';
      in_RDI[0xdcc] = '\0';
      in_RDI[0xdcd] = '\0';
      in_RDI[0xdce] = '\0';
      in_RDI[0xdcf] = '\0';
      in_RDI[0xdd0] = '\0';
      in_RDI[0xdd1] = '\0';
      in_RDI[0xdd2] = '\0';
      in_RDI[0xdd3] = '\0';
      in_RDI[0xdd4] = '\0';
      in_RDI[0xdd5] = '\0';
      in_RDI[0xdd6] = '\0';
      in_RDI[0xdd7] = '\0';
      dVar1 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x53bdca);
      std::__atomic_float<double>::store((__atomic_float<double> *)(in_RDI + 0xdd8),dVar1,seq_cst);
      _Var4 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffda8);
      if (5 < _Var4) {
        BVar8 = (in_RSI->source_id).gid;
        _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffda0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        name._M_str = pcVar9;
        name._M_len = (size_t)in_RSI;
        BrokerBase::sendToLogger
                  ((BrokerBase *)CONCAT44(id.gid,BVar8),in_stack_ffffffffffffff1c,_Var6._M_str._4_4_
                   ,name,in_stack_00000040,_Var6._M_str._3_1_);
      }
    }
    else if (aVar3 == cmd_time_grant) {
      *(baseType *)(in_RDI + 0xdd0) = (in_RSI->actionTime).internalTimeCode;
      dVar1 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x53bebf);
      std::__atomic_float<double>::store((__atomic_float<double> *)(in_RDI + 0xdd8),dVar1,seq_cst);
      local_128[0] = TimeRepresentation<count_time<9,_long>_>::operator-
                               (in_stack_fffffffffffffda8,
                                (TimeRepresentation<count_time<9,_long>_> *)
                                in_stack_fffffffffffffda0);
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>=
                        (local_128,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xdc8));
      if (bVar2) {
        _Var4 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffda8);
        if (5 < _Var4) {
          local_12c = (in_RSI->source_id).gid;
          local_140 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffda0);
          local_180 = "TIME: granted time={}";
          local_178 = 0x15;
          local_188 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x53bf99);
          local_48 = local_170;
          local_58 = local_180;
          uStack_50 = local_178;
          local_60 = &local_188;
          local_78 = local_180;
          uStack_70 = local_178;
          local_38 = local_98;
          local_18 = &local_88;
          local_88 = 10;
          local_40 = local_188;
          local_20 = local_38;
          local_98[0] = local_188;
          local_80 = local_38;
          ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000010,in_stack_00000000);
          local_150 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffda0);
          name_00._M_str = pcVar9;
          name_00._M_len = (size_t)in_RSI;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_150._M_str;
          BrokerBase::sendToLogger
                    ((BrokerBase *)CONCAT44(id.gid,in_stack_ffffffffffffff00),
                     in_stack_ffffffffffffff1c,local_128[4].internalTimeCode._4_4_,name_00,
                     in_stack_00000040,local_128[4].internalTimeCode._3_1_);
          std::__cxx11::string::~string(pbVar7);
        }
        *(undefined8 *)(in_RDI + 0xdc8) = *(undefined8 *)(in_RDI + 0xdd0);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::processTimeMonitorMessage(ActionMessage& message)
{
    if (message.source_id != mTimeMonitorFederateId) {
        return;
    }
    switch (message.action()) {
        case CMD_EXEC_GRANT:
            mTimeMonitorLastLogTime = timeZero;
            mTimeMonitorCurrentTime = timeZero;

            simTime.store(static_cast<double>(mTimeMonitorCurrentTime));
            LOG_SUMMARY(message.source_id, mTimeMonitorFederate, "TIME: exec granted");
            break;
        case CMD_TIME_GRANT:
            mTimeMonitorCurrentTime = message.actionTime;
            simTime.store(static_cast<double>(mTimeMonitorCurrentTime));
            if (mTimeMonitorCurrentTime - mTimeMonitorPeriod >= mTimeMonitorLastLogTime) {
                LOG_SUMMARY(message.source_id,
                            mTimeMonitorFederate,
                            fmt::format("TIME: granted time={}",
                                        static_cast<double>(mTimeMonitorCurrentTime)));
                mTimeMonitorLastLogTime = mTimeMonitorCurrentTime;
            }
            break;
        case CMD_DISCONNECT:
            LOG_SUMMARY(message.source_id,
                        mTimeMonitorFederate,
                        fmt::format("TIME: disconnected, last time {}",
                                    static_cast<double>(mTimeMonitorCurrentTime)));
            mTimeMonitorCurrentTime = Time::maxVal();
            mTimeMonitorLastLogTime = Time::maxVal();
            simTime.store(static_cast<double>(mTimeMonitorCurrentTime));
            break;
        default:
            break;
    }
}